

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

bool __thiscall mocker::ir::BasicBlock::isCompleted(BasicBlock *this)

{
  bool bVar1;
  shared_ptr<mocker::ir::IRInst> local_28;
  BasicBlock *local_18;
  BasicBlock *this_local;
  
  local_18 = this;
  bVar1 = std::__cxx11::
          list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
          ::empty(&this->insts);
  if (bVar1) {
    this_local._7_1_ = 0;
  }
  else {
    std::__cxx11::
    list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
    ::back(&this->insts);
    std::dynamic_pointer_cast<mocker::ir::Terminator,mocker::ir::IRInst>(&local_28);
    this_local._7_1_ = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_28);
    std::shared_ptr<mocker::ir::Terminator>::~shared_ptr
              ((shared_ptr<mocker::ir::Terminator> *)&local_28);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool BasicBlock::isCompleted() const {
  if (insts.empty())
    return false;
  return (bool)std::dynamic_pointer_cast<Terminator>(insts.back());
}